

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O0

AliasRet aa_cnew(jit_State *J,IRIns *refa,IRIns *refb)

{
  IRIns *pIVar1;
  IRIns *cnewb;
  IRIns *cnewa;
  IRIns *refb_local;
  IRIns *refa_local;
  jit_State *J_local;
  
  cnewb = aa_findcnew(J,refa);
  pIVar1 = aa_findcnew(J,refb);
  if (cnewb == pIVar1) {
    J_local._4_4_ = ALIAS_MAY;
  }
  else if ((cnewb == (IRIns *)0x0) || (pIVar1 == (IRIns *)0x0)) {
    cnewa = refb;
    if (pIVar1 != (IRIns *)0x0) {
      cnewb = pIVar1;
      cnewa = refa;
    }
    J_local._4_4_ = aa_escape(J,cnewb,cnewa);
  }
  else {
    J_local._4_4_ = ALIAS_NO;
  }
  return J_local._4_4_;
}

Assistant:

static AliasRet aa_cnew(jit_State *J, IRIns *refa, IRIns *refb)
{
  IRIns *cnewa = aa_findcnew(J, refa);
  IRIns *cnewb = aa_findcnew(J, refb);
  if (cnewa == cnewb)
    return ALIAS_MAY;  /* Same allocation or neither is an allocation. */
  if (cnewa && cnewb)
    return ALIAS_NO;  /* Two different allocations never alias. */
  if (cnewb) { cnewa = cnewb; refb = refa; }
  return aa_escape(J, cnewa, refb);
}